

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

int write_strings(char *sfile)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *local_68;
  char *s_5;
  char *s_4;
  char *s_3;
  char *s_2;
  char *s_1;
  char *s;
  int i;
  Fl_Widget_Type *w;
  Fl_Type *p;
  FILE *fp;
  char *sfile_local;
  
  __stream = (FILE *)fl_fopen(sfile,"w");
  if (__stream == (FILE *)0x0) {
    sfile_local._4_4_ = 1;
  }
  else {
    if (i18n_type == 0) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
          w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
        iVar1 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x17])();
        if (iVar1 != 0) {
          pcVar2 = Fl_Type::label(&w->super_Fl_Type);
          if (pcVar2 != (char *)0x0) {
            for (s_1 = Fl_Type::label(&w->super_Fl_Type); *s_1 != '\0'; s_1 = s_1 + 1) {
              if (((*s_1 < ' ') || ('~' < *s_1)) || (*s_1 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_1);
              }
              else {
                putc((int)*s_1,__stream);
              }
            }
            putc(10,__stream);
          }
          pcVar2 = Fl_Widget_Type::tooltip(w);
          if (pcVar2 != (char *)0x0) {
            for (s_2 = Fl_Widget_Type::tooltip(w); *s_2 != '\0'; s_2 = s_2 + 1) {
              if (((*s_2 < ' ') || ('~' < *s_2)) || (*s_2 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_2);
              }
              else {
                putc((int)*s_2,__stream);
              }
            }
            putc(10,__stream);
          }
        }
      }
    }
    else if (i18n_type == 1) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
          w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
        iVar1 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x17])();
        if (iVar1 != 0) {
          pcVar2 = Fl_Type::label(&w->super_Fl_Type);
          if (pcVar2 != (char *)0x0) {
            fputs("msgid \"",__stream);
            for (s_3 = Fl_Type::label(&w->super_Fl_Type); *s_3 != '\0'; s_3 = s_3 + 1) {
              if (((*s_3 < ' ') || ('~' < *s_3)) || (*s_3 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_3);
              }
              else {
                putc((int)*s_3,__stream);
              }
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            for (s_3 = Fl_Type::label(&w->super_Fl_Type); *s_3 != '\0'; s_3 = s_3 + 1) {
              if (((*s_3 < ' ') || ('~' < *s_3)) || (*s_3 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_3);
              }
              else {
                putc((int)*s_3,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
          pcVar2 = Fl_Widget_Type::tooltip(w);
          if (pcVar2 != (char *)0x0) {
            fputs("msgid \"",__stream);
            for (s_4 = Fl_Widget_Type::tooltip(w); *s_4 != '\0'; s_4 = s_4 + 1) {
              if (((*s_4 < ' ') || ('~' < *s_4)) || (*s_4 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_4);
              }
              else {
                putc((int)*s_4,__stream);
              }
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            for (s_4 = Fl_Widget_Type::tooltip(w); *s_4 != '\0'; s_4 = s_4 + 1) {
              if (((*s_4 < ' ') || ('~' < *s_4)) || (*s_4 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_4);
              }
              else {
                putc((int)*s_4,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
        }
      }
    }
    else if (i18n_type == 2) {
      fprintf(__stream,"$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      fprintf(__stream,"$set %s\n",i18n_set);
      fputs("$quote \"\n",__stream);
      for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
          w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
        iVar1 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x17])();
        if (iVar1 != 0) {
          pcVar2 = Fl_Type::label(&w->super_Fl_Type);
          if (pcVar2 != (char *)0x0) {
            fprintf(__stream,"%d \"");
            for (s_5 = Fl_Type::label(&w->super_Fl_Type); *s_5 != '\0'; s_5 = s_5 + 1) {
              if (((*s_5 < ' ') || ('~' < *s_5)) || (*s_5 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*s_5);
              }
              else {
                putc((int)*s_5,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
          pcVar2 = Fl_Widget_Type::tooltip(w);
          if (pcVar2 != (char *)0x0) {
            fprintf(__stream,"%d \"");
            for (local_68 = Fl_Widget_Type::tooltip(w); *local_68 != '\0'; local_68 = local_68 + 1)
            {
              if (((*local_68 < ' ') || ('~' < *local_68)) || (*local_68 == '\"')) {
                fprintf(__stream,"\\%03o",(ulong)(uint)(int)*local_68);
              }
              else {
                putc((int)*local_68,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
        }
      }
    }
    sfile_local._4_4_ = fclose(__stream);
  }
  return sfile_local._4_4_;
}

Assistant:

int write_strings(const char *sfile) {
  FILE *fp = fl_fopen(sfile, "w");
  Fl_Type *p;
  Fl_Widget_Type *w;
  int i;

  if (!fp) return 1;

  switch (i18n_type) {
  case 0 : /* None, just put static text out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }

	  if (w->tooltip()) {
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }
	}
      }
      break;
  case 1 : /* GNU gettext, put a .po file out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  case 2 : /* POSIX catgets, put a .msg file out */
      fprintf(fp, "$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      fprintf(fp, "$set %s\n", i18n_set);
      fputs("$quote \"\n", fp);

      for (i = 1, p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  }

  return fclose(fp);
}